

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# portmidi.c
# Opt level: O0

void pm_flush_sysex(PmInternal *midi,PmTimestamp timestamp)

{
  PmError PVar1;
  PmMessage local_1c;
  PmTimestamp local_18;
  PmEvent event;
  PmTimestamp timestamp_local;
  PmInternal *midi_local;
  
  if (midi->sysex_message_count != 0) {
    local_1c = midi->sysex_message;
    local_18 = timestamp;
    event.message = timestamp;
    unique0x1000006a = midi;
    PVar1 = Pm_Enqueue(midi->queue,&local_1c);
    if (PVar1 == pmBufferOverflow) {
      stack0xfffffffffffffff0->sysex_in_progress = 0;
    }
    stack0xfffffffffffffff0->sysex_message_count = 0;
    stack0xfffffffffffffff0->sysex_message = 0;
  }
  return;
}

Assistant:

static void pm_flush_sysex(PmInternal *midi, PmTimestamp timestamp)
{
    PmEvent event;
    
    /* there may be nothing in the buffer */
    if (midi->sysex_message_count == 0) return; /* nothing to flush */
    
    event.message = midi->sysex_message;
    event.timestamp = timestamp;
    /* copied from pm_read_short, avoids filtering */
    if (Pm_Enqueue(midi->queue, &event) == pmBufferOverflow) {
        midi->sysex_in_progress = FALSE;
    }
    midi->sysex_message_count = 0;
    midi->sysex_message = 0;
}